

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall GraphTestDepfileOverride::~GraphTestDepfileOverride(GraphTestDepfileOverride *this)

{
  GraphTestDepfileOverride *this_local;
  
  GraphTest::~GraphTest(&this->super_GraphTest);
  return;
}

Assistant:

TEST_F(GraphTest, DepfileOverride) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule r\n"
"  depfile = x\n"
"  command = unused\n"
"build out: r in\n"
"  depfile = y\n"));
  Edge* edge = GetNode("out")->in_edge();
  EXPECT_EQ("y", edge->GetBinding("depfile"));
}